

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::LoadIniSettingsFromMemory(char *ini_data,size_t ini_size)

{
  ImGuiContext *pIVar1;
  char *__dest;
  char *pcVar2;
  char *pcVar3;
  ImGuiSettingsHandler *pIVar4;
  void *pvVar5;
  char *pcVar6;
  char *pcVar7;
  
  pIVar1 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0x2448,"void ImGui::LoadIniSettingsFromMemory(const char *, size_t)");
  }
  if ((GImGui->SettingsLoaded == false) && (GImGui->FrameCount == 0)) {
    if (ini_size == 0) {
      ini_size = strlen(ini_data);
    }
    __dest = (char *)MemAlloc(ini_size + 1);
    memcpy(__dest,ini_data,ini_size);
    __dest[ini_size] = '\0';
    pIVar4 = (ImGuiSettingsHandler *)0x0;
    pvVar5 = (void *)0x0;
    pcVar6 = __dest;
    while (pcVar6 < __dest + ini_size) {
      for (; (*pcVar6 == '\n' || (pcVar7 = pcVar6, *pcVar6 == '\r')); pcVar6 = pcVar6 + 1) {
      }
      for (; ((pcVar7 < __dest + ini_size && (*pcVar7 != '\n')) && (*pcVar7 != '\r'));
          pcVar7 = pcVar7 + 1) {
      }
      *pcVar7 = '\0';
      if (*pcVar6 != ';') {
        if (((*pcVar6 == '[') && (pcVar6 < pcVar7)) && (pcVar7[-1] == ']')) {
          pcVar3 = pcVar7 + -1;
          *pcVar3 = '\0';
          pcVar6 = pcVar6 + 1;
          pcVar2 = ImStrchrRange(pcVar6,pcVar3,']');
          if ((pcVar2 == (char *)0x0) ||
             (pcVar3 = ImStrchrRange(pcVar2 + 1,pcVar3,'['), pcVar3 == (char *)0x0)) {
            pcVar2 = "Window";
          }
          else {
            *pcVar2 = '\0';
            pcVar2 = pcVar6;
            pcVar6 = pcVar3 + 1;
          }
          pIVar4 = FindSettingsHandler(pcVar2);
          if (pIVar4 == (ImGuiSettingsHandler *)0x0) {
            pIVar4 = (ImGuiSettingsHandler *)0x0;
            pvVar5 = (void *)0x0;
          }
          else {
            pvVar5 = (*pIVar4->ReadOpenFn)(pIVar1,pIVar4,pcVar6);
          }
        }
        else if ((pIVar4 != (ImGuiSettingsHandler *)0x0) && (pvVar5 != (void *)0x0)) {
          (*pIVar4->ReadLineFn)(pIVar1,pIVar4,pvVar5,pcVar6);
        }
      }
      pcVar6 = pcVar7 + 1;
    }
    MemFree(__dest);
    pIVar1->SettingsLoaded = true;
    return;
  }
  __assert_fail("g.SettingsLoaded == false && g.FrameCount == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                ,0x2449,"void ImGui::LoadIniSettingsFromMemory(const char *, size_t)");
}

Assistant:

void ImGui::LoadIniSettingsFromMemory(const char* ini_data, size_t ini_size)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    IM_ASSERT(g.SettingsLoaded == false && g.FrameCount == 0);

    // For user convenience, we allow passing a non zero-terminated string (hence the ini_size parameter).
    // For our convenience and to make the code simpler, we'll also write zero-terminators within the buffer. So let's create a writable copy..
    if (ini_size == 0)
        ini_size = strlen(ini_data);
    char* buf = (char*)IM_ALLOC(ini_size + 1);
    char* buf_end = buf + ini_size;
    memcpy(buf, ini_data, ini_size);
    buf[ini_size] = 0;

    void* entry_data = NULL;
    ImGuiSettingsHandler* entry_handler = NULL;

    char* line_end = NULL;
    for (char* line = buf; line < buf_end; line = line_end + 1)
    {
        // Skip new lines markers, then find end of the line
        while (*line == '\n' || *line == '\r')
            line++;
        line_end = line;
        while (line_end < buf_end && *line_end != '\n' && *line_end != '\r')
            line_end++;
        line_end[0] = 0;
        if (line[0] == ';')
            continue;
        if (line[0] == '[' && line_end > line && line_end[-1] == ']')
        {
            // Parse "[Type][Name]". Note that 'Name' can itself contains [] characters, which is acceptable with the current format and parsing code.
            line_end[-1] = 0;
            const char* name_end = line_end - 1;
            const char* type_start = line + 1;
            char* type_end = (char*)(intptr_t)ImStrchrRange(type_start, name_end, ']');
            const char* name_start = type_end ? ImStrchrRange(type_end + 1, name_end, '[') : NULL;
            if (!type_end || !name_start)
            {
                name_start = type_start; // Import legacy entries that have no type
                type_start = "Window";
            }
            else
            {
                *type_end = 0; // Overwrite first ']'
                name_start++;  // Skip second '['
            }
            entry_handler = FindSettingsHandler(type_start);
            entry_data = entry_handler ? entry_handler->ReadOpenFn(&g, entry_handler, name_start) : NULL;
        }
        else if (entry_handler != NULL && entry_data != NULL)
        {
            // Let type handler parse the line
            entry_handler->ReadLineFn(&g, entry_handler, entry_data, line);
        }
    }
    IM_FREE(buf);
    g.SettingsLoaded = true;
}